

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O0

int FindNode(sockaddr_in *address)

{
  int local_14;
  int i;
  sockaddr_in *address_local;
  
  local_14 = 0;
  while ((local_14 < doomcom.numnodes &&
         (((address->sin_addr).s_addr != sendaddress[local_14].sin_addr.s_addr ||
          (address->sin_port != sendaddress[local_14].sin_port))))) {
    local_14 = local_14 + 1;
  }
  if (local_14 == doomcom.numnodes) {
    local_14 = -1;
  }
  return local_14;
}

Assistant:

int FindNode (const sockaddr_in *address)
{
	int i;

	// find remote node number
	for (i = 0; i<doomcom.numnodes; i++)
		if (address->sin_addr.s_addr == sendaddress[i].sin_addr.s_addr
			&& address->sin_port == sendaddress[i].sin_port)
			break;

	if (i == doomcom.numnodes)
	{
		// packet is not from one of the players (new game broadcast?)
		i = -1;
	}
	return i;
}